

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

void vprint_message(char *format,__va_list_tag *args)

{
  __gnuc_va_list in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  char buffer [1024];
  char local_408 [1024];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  vsnprintf(local_408,0x400,in_RDI,in_RSI);
  printf("%s",local_408);
  fflush(_stdout);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void vprint_message(const char* const format, va_list args) {
    char buffer[1024];
    vsnprintf(buffer, sizeof(buffer), format, args);
    printf("%s", buffer);
    fflush(stdout);
#ifdef _WIN32
    OutputDebugString(buffer);
#endif /* _WIN32 */
}